

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O1

void Diffusion::setBeta(MLEBABecLap *op,MultiFab **beta,int betaComp,int nComp)

{
  long lVar1;
  Array<MultiFab,_3> bcoeffs;
  Array<const_MultiFab_*,_3> local_4c8;
  MultiFab local_4b0 [3];
  
  amrex::MultiFab::MultiFab(local_4b0,*beta,make_alias,betaComp,nComp);
  amrex::MultiFab::MultiFab(local_4b0 + 1,beta[1],make_alias,betaComp,nComp);
  amrex::MultiFab::MultiFab(local_4b0 + 2,beta[2],make_alias,betaComp,nComp);
  local_4c8._M_elems[0] = local_4b0;
  local_4c8._M_elems[1] = local_4b0 + 1;
  local_4c8._M_elems[2] = local_4b0 + 2;
  amrex::MLEBABecLap::setBCoeffs(op,0,&local_4c8,FaceCentroid);
  lVar1 = 0x300;
  do {
    amrex::MultiFab::~MultiFab
              ((MultiFab *)
               ((long)&local_4b0[0].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                       _vptr_FabArrayBase + lVar1));
    lVar1 = lVar1 + -0x180;
  } while (lVar1 != -0x180);
  return;
}

Assistant:

void
Diffusion::setBeta(MLEBABecLap&           op,
                   const MultiFab* const* beta,
                   int                    betaComp,
                   int                    nComp)
{
    Array<MultiFab,AMREX_SPACEDIM> bcoeffs{
    AMREX_D_DECL(MultiFab(*beta[0], amrex::make_alias, betaComp, nComp),
                 MultiFab(*beta[1], amrex::make_alias, betaComp, nComp),
                 MultiFab(*beta[2], amrex::make_alias, betaComp, nComp) ) };

    op.setBCoeffs(0, amrex::GetArrOfConstPtrs(bcoeffs), MLLinOp::Location::FaceCentroid);
}